

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stlio.hpp
# Opt level: O0

void tyti::stl::write_binary<float,std::__cxx11::stringstream>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *out,
               basic_solid<float> *s)

{
  string *psVar1;
  basic_solid<float> *pbVar2;
  unsigned_long *puVar3;
  size_type sVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  size_type local_c0;
  size_t i;
  size_type local_b0;
  unsigned_long local_a8;
  size_t num_triangles;
  char *local_98;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  unsigned_long local_88;
  unsigned_long local_80;
  size_t to_write;
  char header_buffer [80];
  unsigned_long local_20;
  size_t HEADER_SIZE;
  basic_solid<float> *s_local;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *out_local;
  
  local_20 = 0x50;
  HEADER_SIZE = (size_t)s;
  s_local = (basic_solid<float> *)out;
  local_88 = std::__cxx11::string::size();
  puVar3 = std::min<unsigned_long>(&local_88,&local_20);
  local_80 = *puVar3;
  local_90._M_current = (char *)std::__cxx11::string::begin();
  local_98 = (char *)std::__cxx11::string::end();
  std::copy<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char*>
            (local_90,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )local_98,(char *)&to_write);
  num_triangles._7_1_ = 0;
  std::fill<char*,char>
            (header_buffer + (local_80 - 8),header_buffer + 0x48,(char *)((long)&num_triangles + 7))
  ;
  std::ostream::write((s_local->header).field_2._M_local_buf,(long)&to_write);
  local_b0 = std::
             vector<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>::
             size((vector<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>
                   *)(HEADER_SIZE + 0x20));
  sVar4 = std::vector<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>
          ::size((vector<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>
                  *)(HEADER_SIZE + 0x38));
  i = sVar4 / 3;
  puVar3 = std::min<unsigned_long>(&local_b0,&i);
  local_a8 = *puVar3;
  std::ostream::write((s_local->header).field_2._M_local_buf,(long)&local_a8);
  for (local_c0 = 0; pbVar2 = s_local, local_c0 < local_a8; local_c0 = local_c0 + 1) {
    pvVar5 = std::
             vector<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>::
             operator[]((vector<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>
                         *)(HEADER_SIZE + 0x20),local_c0);
    detail::write_vectorF32<std::__cxx11::stringstream>
              ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)pbVar2,
               pvVar5->data);
    pbVar2 = s_local;
    pvVar5 = std::
             vector<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>::
             operator[]((vector<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>
                         *)(HEADER_SIZE + 0x38),local_c0 * 3);
    detail::write_vectorF32<std::__cxx11::stringstream>
              ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)pbVar2,
               pvVar5->data);
    pbVar2 = s_local;
    pvVar5 = std::
             vector<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>::
             operator[]((vector<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>
                         *)(HEADER_SIZE + 0x38),local_c0 * 3 + 1);
    detail::write_vectorF32<std::__cxx11::stringstream>
              ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)pbVar2,
               pvVar5->data);
    pbVar2 = s_local;
    pvVar5 = std::
             vector<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>::
             operator[]((vector<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>
                         *)(HEADER_SIZE + 0x38),local_c0 * 3 + 2);
    detail::write_vectorF32<std::__cxx11::stringstream>
              ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)pbVar2,
               pvVar5->data);
    sVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                       (HEADER_SIZE + 0x50));
    if (local_c0 < sVar4) {
      psVar1 = &s_local->header;
      pvVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                          (HEADER_SIZE + 0x50),local_c0);
      std::ostream::write((psVar1->field_2)._M_local_buf,(long)pvVar6);
    }
  }
  return;
}

Assistant:

void write_binary(streamT& out, const basic_solid<T>& s)
        {
            // fill header buffer
            const size_t HEADER_SIZE = 80;
            char header_buffer[HEADER_SIZE];
            const size_t to_write = std::min(s.header.size(), HEADER_SIZE);
            std::copy(s.header.begin(), s.header.end(), header_buffer);
            std::fill(header_buffer+to_write, header_buffer+HEADER_SIZE, char(0));
            
            out.write(header_buffer, 80);

            const size_t num_triangles{ std::min(s.normals.size(), s.vertices.size()/3) };

            out.write(reinterpret_cast<const char*>(&num_triangles), 4);

            for (size_t i = 0; i < num_triangles; ++i)
            {
                //we cannot do direct writ
                detail::write_vectorF32(out, s.normals[i].data);
                detail::write_vectorF32(out, s.vertices[3 * i + 0].data);
                detail::write_vectorF32(out, s.vertices[3 * i + 1].data);
                detail::write_vectorF32(out, s.vertices[3 * i + 2].data);
                if (i < s.attributes.size())
                    out.write(reinterpret_cast<const char*>(&s.attributes[i]), sizeof(uint16_t));
            }
        }